

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Wasm::WasmBytecodeGenerator::GenerateFunction(WasmBytecodeGenerator *this)

{
  FunctionBody *pFVar1;
  IWasmByteCodeWriter *pIVar2;
  InterruptPoller *pIVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint label;
  uint32 uVar8;
  int iVar9;
  undefined4 *puVar10;
  BlockInfo *pBVar11;
  FunctionInfo *pFVar12;
  AsmJsFunctionInfo *funcInfo;
  WasmCompilationException *pWVar13;
  WasmBinaryReader *pWVar14;
  PolymorphicEmitInfo PVar15;
  undefined1 local_68 [8];
  PolymorphicEmitInfo yieldInfo;
  AutoProfilingPhase functionProfiler;
  AutoDisableInterrupt autoDisableInterrupt;
  AutoCleanupGeneratorState autoCleanupGeneratorState;
  
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmBytecodePhase);
  }
  else {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar12 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_00f1c474;
      *puVar10 = 0;
      pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmBytecodePhase,uVar6,pFVar12->functionId);
  }
  if (bVar5 != false) {
    Output::Print(L"Generate WebAssembly Bytecode: ");
    Js::FunctionBody::DumpFullFunctionName((this->m_funcInfo->m_body).ptr);
    Output::Print(L"\n");
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar12 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00f1c474;
    *puVar10 = 0;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,WasmBytecodePhase,uVar6,pFVar12->functionId)
  ;
  if (bVar5) {
    pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar13,L"Compilation skipped");
    __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  yieldInfo.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)this->m_scriptContext;
  functionProfiler.scriptcontext._0_2_ = 0x23;
  functionProfiler.scriptcontext._2_1_ = 0;
  Js::ScriptContext::ProfileBegin((ScriptContext *)yieldInfo.field_1.infos,WasmBytecodePhase);
  this->m_maxArgOutDepth = 0;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[1])
            (this->m_writer,(this->m_funcInfo->m_body).ptr,&this->m_alloc);
  autoDisableInterrupt._8_8_ = this;
  uVar7 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  this->m_funcInfo->m_ExitLabel = uVar7;
  EnregisterLocals(this);
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  uVar8 = WasmSignature::GetSignatureId((this->m_funcInfo->m_signature).ptr);
  pBVar11 = PushLabel(this,(WasmBlock)((ulong)uVar8 << 0x20),label,true,false);
  this->m_funcBlock = pBVar11;
  EnterEvalStackScope(this,pBVar11);
  EmitBlockCommon(this,this->m_funcBlock,(bool *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar15 = PopLabel(this,label);
  yieldInfo._0_8_ = PVar15.field_1;
  local_68._0_4_ = PVar15.count;
  if (local_68._0_4_ == 0) {
    uVar8 = WasmFunctionInfo::GetResultCount(this->m_funcInfo);
    if (uVar8 == 0) goto LAB_00f1bff4;
  }
  else {
LAB_00f1bff4:
    EmitReturnExpr(this,(PolymorphicEmitInfo *)local_68);
  }
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    pBVar11 = (BlockInfo *)0x23;
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,WasmBytecodePhase);
  }
  else {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar1);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar12 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_00f1c474;
      *puVar10 = 0;
      pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    pBVar11 = (BlockInfo *)0x23;
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,WasmBytecodePhase,uVar6,pFVar12->functionId);
  }
  if (bVar5 != false) {
    PrintOpEnd(this);
  }
  ExitEvalStackScope(this,pBVar11);
  pIVar2 = this->m_originalWriter;
  this->m_writer = pIVar2;
  this->isUnreachable = false;
  (*pIVar2->_vptr_IWasmByteCodeWriter[6])(pIVar2,(ulong)uVar7);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[7])(this->m_writer,8);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x21])(this->m_writer,(ulong)this->currentProfileId);
  pWVar14 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar14 == (WasmBinaryReader *)0x0) {
    pWVar14 = (this->m_module->m_reader).ptr;
  }
  iVar9 = (*(pWVar14->super_WasmReaderBase)._vptr_WasmReaderBase[1])();
  if ((char)iVar9 == '\0') {
    pWVar13 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(pWVar13,L"Invalid function format");
    __cxa_throw(pWVar13,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[2])();
  pWVar14 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar14 == (WasmBinaryReader *)0x0) {
    pWVar14 = (this->m_module->m_reader).ptr;
  }
  (*(pWVar14->super_WasmReaderBase)._vptr_WasmReaderBase[3])();
  autoDisableInterrupt.m_operationCompleted = false;
  autoDisableInterrupt.m_interruptDisableState = false;
  autoDisableInterrupt.m_explicitCompletion = false;
  autoDisableInterrupt._11_5_ = 0;
  functionProfiler._8_8_ = this->m_scriptContext->threadContext;
  autoDisableInterrupt.m_threadContext._0_2_ = 0;
  autoDisableInterrupt.m_threadContext._2_1_ = 1;
  pIVar3 = ((ThreadContext *)functionProfiler._8_8_)->interruptPoller;
  if (pIVar3 != (InterruptPoller *)0x0) {
    autoDisableInterrupt.m_threadContext._0_2_ = (ushort)pIVar3->isDisabled << 8;
    pIVar3->isDisabled = true;
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar12 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00f1c474;
    *puVar10 = 0;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,WasmBytecodePhase,uVar6,pFVar12->functionId)
  ;
  if (bVar5) {
LAB_00f1c30a:
    if (this->m_originalWriter != this->m_emptyWriter) {
      Js::AsmJsByteCodeDumper::Dump
                ((this->m_funcInfo->m_body).ptr,&this->mTypedRegisterAllocator,(AsmJsFunc *)0x0);
    }
  }
  else {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
    pFVar1 = (this->m_funcInfo->m_body).ptr;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar12 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_00f1c474;
      *puVar10 = 0;
      pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015962f8,ByteCodePhase,uVar6,pFVar12->functionId);
    if (bVar5) goto LAB_00f1c30a;
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(this->m_funcInfo->m_body).ptr);
  pFVar1 = (this->m_funcInfo->m_body).ptr;
  pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar12 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) {
LAB_00f1c474:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
    pFVar12 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar5 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015962f8,WasmOpCodeDistributionPhase,uVar6,pFVar12->functionId);
  if (bVar5) {
    WasmBinaryReader::PrintOps((this->m_module->m_reader).ptr);
  }
  funcInfo = (AsmJsFunctionInfo *)
             Js::FunctionProxy::GetAuxPtr
                       ((FunctionProxy *)(this->m_funcInfo->m_body).ptr,AsmJsFunctionInfo);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionBody
            (&this->mTypedRegisterAllocator,(this->m_funcInfo->m_body).ptr);
  WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
            (&this->mTypedRegisterAllocator,funcInfo,(this->m_funcInfo->m_body).ptr);
  Js::FunctionBody::CheckAndSetOutParamMaxDepth
            ((this->m_funcInfo->m_body).ptr,this->m_maxArgOutDepth);
  autoDisableInterrupt.m_threadContext._0_1_ = 1;
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&functionProfiler.phase);
  GenerateFunction::AutoCleanupGeneratorState::~AutoCleanupGeneratorState
            ((AutoCleanupGeneratorState *)&autoDisableInterrupt.m_operationCompleted);
  Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)&yieldInfo.field_1.singleInfo);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunction()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (DO_WASM_TRACE_BYTECODE)
    {
        Output::Print(_u("Generate WebAssembly Bytecode: "));
        GetFunctionBody()->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif
    if (PHASE_OFF(Js::WasmBytecodePhase, GetFunctionBody()))
    {
        throw WasmCompilationException(_u("Compilation skipped"));
    }
    Js::AutoProfilingPhase functionProfiler(m_scriptContext, Js::WasmBytecodePhase);
    Unused(functionProfiler);

    m_maxArgOutDepth = 0;

    m_writer->Begin(GetFunctionBody(), &m_alloc);
    struct AutoCleanupGeneratorState
    {
        WasmBytecodeGenerator* gen;
        AutoCleanupGeneratorState(WasmBytecodeGenerator* gen) : gen(gen) {}
        ~AutoCleanupGeneratorState()
        {
            if (gen)
            {
                TRACE_WASM(PHASE_TRACE(Js::WasmBytecodePhase, gen->GetFunctionBody()), _u("\nHad Compilation error!"));
                gen->GetReader()->FunctionEnd();
                gen->m_originalWriter->Reset();
            }
        }
        void Complete()
        {
            gen->m_writer->End();
            gen->GetReader()->FunctionEnd();
            gen = nullptr;
        }
    };
    AutoCleanupGeneratorState autoCleanupGeneratorState(this);
    Js::ByteCodeLabel exitLabel = m_writer->DefineLabel();
    m_funcInfo->SetExitLabel(exitLabel);
    EnregisterLocals();

    // The function's yield type is the return type
    Js::ByteCodeLabel blockLabel = m_writer->DefineLabel();
    WasmBlock funcBlockData;
    funcBlockData.SetSignatureId(m_funcInfo->GetSignature()->GetSignatureId());
    m_funcBlock = PushLabel(funcBlockData, blockLabel, true, false);
    EnterEvalStackScope(m_funcBlock);
    EmitBlockCommon(m_funcBlock);
    m_writer->MarkAsmJsLabel(blockLabel);
    PolymorphicEmitInfo yieldInfo = PopLabel(blockLabel);
    if (yieldInfo.Count() > 0 || m_funcInfo->GetResultCount() == 0)
    {
        EmitReturnExpr(&yieldInfo);
    }
    DebugPrintOpEnd();
    ExitEvalStackScope(m_funcBlock);
    SetUnreachableState(false);
    m_writer->MarkAsmJsLabel(exitLabel);
    m_writer->EmptyAsm(Js::OpCodeAsmJs::Ret);
    m_writer->SetCallSiteCount(this->currentProfileId);

    if (!GetReader()->IsCurrentFunctionCompleted())
    {
        throw WasmCompilationException(_u("Invalid function format"));
    }

    autoCleanupGeneratorState.Complete();
    // Make sure we don't have any unforeseen exceptions as we finalize the body
    AutoDisableInterrupt autoDisableInterrupt(m_scriptContext->GetThreadContext(), true);

#if DBG_DUMP
    if ((
        PHASE_DUMP(Js::WasmBytecodePhase, GetFunctionBody()) ||
        PHASE_DUMP(Js::ByteCodePhase, GetFunctionBody()) 
        ) && !IsValidating())
    {
        Js::AsmJsByteCodeDumper::Dump(GetFunctionBody(), &mTypedRegisterAllocator, nullptr);
    }
    if (PHASE_DUMP(Js::WasmOpCodeDistributionPhase, GetFunctionBody()))
    {
        m_module->GetReader()->PrintOps();
    }
#endif

    Js::AsmJsFunctionInfo* info = GetFunctionBody()->GetAsmJsFunctionInfo();
    mTypedRegisterAllocator.CommitToFunctionBody(GetFunctionBody());
    mTypedRegisterAllocator.CommitToFunctionInfo(info, GetFunctionBody());

    GetFunctionBody()->CheckAndSetOutParamMaxDepth(m_maxArgOutDepth);
    autoDisableInterrupt.Completed();
}